

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall hdc::Lex::Lex(Lex *this)

{
  mapped_type *pmVar1;
  allocator local_1211;
  string local_1210 [39];
  allocator local_11e9;
  string local_11e8 [39];
  allocator local_11c1;
  string local_11c0 [39];
  allocator local_1199;
  string local_1198 [39];
  allocator local_1171;
  string local_1170 [39];
  allocator local_1149;
  string local_1148 [39];
  allocator local_1121;
  string local_1120 [39];
  allocator local_10f9;
  string local_10f8 [39];
  allocator local_10d1;
  string local_10d0 [39];
  allocator local_10a9;
  string local_10a8 [39];
  allocator local_1081;
  string local_1080 [39];
  allocator local_1059;
  string local_1058 [39];
  allocator local_1031;
  string local_1030 [39];
  allocator local_1009;
  string local_1008 [39];
  allocator local_fe1;
  string local_fe0 [39];
  allocator local_fb9;
  string local_fb8 [39];
  allocator local_f91;
  string local_f90 [39];
  allocator local_f69;
  string local_f68 [39];
  allocator local_f41;
  string local_f40 [39];
  allocator local_f19;
  string local_f18 [39];
  allocator local_ef1;
  string local_ef0 [39];
  allocator local_ec9;
  string local_ec8 [39];
  allocator local_ea1;
  string local_ea0 [39];
  allocator local_e79;
  string local_e78 [39];
  allocator local_e51;
  string local_e50 [39];
  allocator local_e29;
  string local_e28 [39];
  allocator local_e01;
  string local_e00 [39];
  allocator local_dd9;
  string local_dd8 [39];
  allocator local_db1;
  string local_db0 [39];
  allocator local_d89;
  string local_d88 [39];
  allocator local_d61;
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [39];
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [39];
  allocator local_c71;
  string local_c70 [39];
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [39];
  allocator local_ba9;
  string local_ba8 [39];
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [39];
  allocator local_b31;
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [39];
  allocator local_a69;
  string local_a68 [39];
  allocator local_a41;
  string local_a40 [39];
  allocator local_a19;
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [39];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [39];
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [32];
  value_type local_20 [4];
  Lex *local_10;
  Lex *this_local;
  
  local_10 = this;
  std::stack<hdc::TokenKind,std::deque<hdc::TokenKind,std::allocator<hdc::TokenKind>>>::
  stack<std::deque<hdc::TokenKind,std::allocator<hdc::TokenKind>>,void>
            ((stack<hdc::TokenKind,std::deque<hdc::TokenKind,std::allocator<hdc::TokenKind>>> *)
             &this->blockStack);
  std::__cxx11::string::string((string *)&this->buffer);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::vector(&this->tokens);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->indentationStack);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
  ::map(&this->keywordsMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
  ::map(&this->operatorMap);
  this->row = 1;
  this->column = 1;
  this->idx = 0;
  this->lexemBegin = 0;
  this->lexemEnd = 0;
  this->newline = true;
  this->hasLexem = false;
  local_20[0] = 0;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->indentationStack,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"def",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_40);
  *pmVar1 = TK_DEF;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"class",&local_69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_68);
  *pmVar1 = TK_CLASS;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"var",&local_91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_90);
  *pmVar1 = TK_VAR;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"const",&local_b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_b8);
  *pmVar1 = TK_CONSTANT;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"constant",&local_e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_e0);
  *pmVar1 = TK_CONSTANT;
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"struct",&local_109);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_108);
  *pmVar1 = TK_STRUCT;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"enum",&local_131);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_130);
  *pmVar1 = TK_ENUM;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"union",&local_159);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_158);
  *pmVar1 = TK_UNION;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"new",&local_181);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_180);
  *pmVar1 = TK_NEW;
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"delete",&local_1a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_1a8);
  *pmVar1 = TK_DELETE;
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"case",&local_1d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_1d0);
  *pmVar1 = TK_CASE;
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"default",&local_1f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_1f8);
  *pmVar1 = TK_DEFAULT;
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"with",&local_221);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_220);
  *pmVar1 = TK_WITH;
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"pass",&local_249);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_248);
  *pmVar1 = TK_PASS;
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"do",&local_271);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_270);
  *pmVar1 = TK_DO;
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"from",&local_299);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_298);
  *pmVar1 = TK_FROM;
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"sizeof",&local_2c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_2c0);
  *pmVar1 = TK_SIZEOF;
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"import",&local_2e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_2e8);
  *pmVar1 = TK_IMPORT;
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"as",&local_311);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_310);
  *pmVar1 = TK_AS;
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"in",&local_339);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_338);
  *pmVar1 = TK_IN;
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"null",&local_361);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_360);
  *pmVar1 = TK_NULL;
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"true",&local_389);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_388);
  *pmVar1 = TK_TRUE;
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"false",&local_3b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_3b0);
  *pmVar1 = TK_FALSE;
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"if",&local_3d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_3d8);
  *pmVar1 = TK_IF;
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"elif",&local_401);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_400);
  *pmVar1 = TK_ELIF;
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"else",&local_429);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_428);
  *pmVar1 = TK_ELSE;
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"for",&local_451);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_450);
  *pmVar1 = TK_FOR;
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"while",&local_479);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_478);
  *pmVar1 = TK_WHILE;
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"break",&local_4a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_4a0);
  *pmVar1 = TK_BREAK;
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"continue",&local_4c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_4c8);
  *pmVar1 = TK_CONTINUE;
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"goto",&local_4f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_4f0);
  *pmVar1 = TK_GOTO;
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"yield",&local_519);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_518);
  *pmVar1 = TK_YIELD;
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"return",&local_541);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_540);
  *pmVar1 = TK_RETURN;
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"and",&local_569);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_568);
  *pmVar1 = TK_AND;
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"or",&local_591);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_590);
  *pmVar1 = TK_OR;
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"not",&local_5b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_5b8);
  *pmVar1 = TK_NOT;
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"u8",&local_5e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_5e0);
  *pmVar1 = TK_U8;
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"u16",&local_609);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_608);
  *pmVar1 = TK_U16;
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"u32",&local_631);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_630);
  *pmVar1 = TK_U32;
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"u64",&local_659);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_658);
  *pmVar1 = TK_U64;
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"i8",&local_681);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_680);
  *pmVar1 = TK_I8;
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"i16",&local_6a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_6a8);
  *pmVar1 = TK_I16;
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"i32",&local_6d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_6d0);
  *pmVar1 = TK_I32;
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"i64",&local_6f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_6f8);
  *pmVar1 = TK_I64;
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"void",&local_721);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_720);
  *pmVar1 = TK_VOID;
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"symbol",&local_749);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_748);
  *pmVar1 = TK_SYMBOL;
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"bool",&local_771);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_770);
  *pmVar1 = TK_BOOL;
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"uchar",&local_799);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_798);
  *pmVar1 = TK_UCHAR;
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"char",&local_7c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_7c0);
  *pmVar1 = TK_CHAR;
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"ushort",&local_7e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_7e8);
  *pmVar1 = TK_USHORT;
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"short",&local_811);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_810);
  *pmVar1 = TK_SHORT;
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"uint",&local_839);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_838);
  *pmVar1 = TK_UINT;
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"int",&local_861);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_860);
  *pmVar1 = TK_INT;
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"ulong",&local_889);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_888);
  *pmVar1 = TK_ULONG;
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"long",&local_8b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_8b0);
  *pmVar1 = TK_LONG;
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"float",&local_8d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_8d8);
  *pmVar1 = TK_FLOAT;
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_900,"double",&local_901);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->keywordsMap,(key_type *)local_900);
  *pmVar1 = TK_DOUBLE;
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_928,"++",&local_929);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_928);
  *pmVar1 = TK_INC;
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"--",&local_951);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_950);
  *pmVar1 = TK_DEC;
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"+",&local_979);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_978);
  *pmVar1 = TK_PLUS;
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a0,"-",&local_9a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_9a0);
  *pmVar1 = TK_MINUS;
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"*",&local_9c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_9c8);
  *pmVar1 = TK_TIMES;
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"/",&local_9f1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_9f0);
  *pmVar1 = TK_DIVISION;
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a18,"//",&local_a19);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_a18);
  *pmVar1 = TK_INTEGER_DIVISION;
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a40,"%",&local_a41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_a40);
  *pmVar1 = TK_MODULO;
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"**",&local_a69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_a68);
  *pmVar1 = TK_POWER;
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a90,"==",&local_a91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_a90);
  *pmVar1 = TK_EQ;
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab8,"!=",&local_ab9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ab8);
  *pmVar1 = TK_NE;
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,">",&local_ae1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ae0);
  *pmVar1 = TK_GT;
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b08,"<",&local_b09);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_b08);
  *pmVar1 = TK_LT;
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b30,">=",&local_b31);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_b30);
  *pmVar1 = TK_GE;
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b58,"<=",&local_b59);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_b58);
  *pmVar1 = TK_LE;
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b80,"&",&local_b81);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_b80);
  *pmVar1 = TK_BITWISE_AND;
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba8,"|",&local_ba9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ba8);
  *pmVar1 = TK_BITWISE_OR;
  std::__cxx11::string::~string(local_ba8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd0,"^",&local_bd1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_bd0);
  *pmVar1 = TK_BITWISE_XOR;
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"~",&local_bf9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_bf8);
  *pmVar1 = TK_BITWISE_NOT;
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c20,"<<",&local_c21);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_c20);
  *pmVar1 = TK_SLL;
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,">>",&local_c49);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_c48);
  *pmVar1 = TK_SRA;
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c70,">>>",&local_c71);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_c70);
  *pmVar1 = TK_SRL;
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c98,"&&",&local_c99);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_c98);
  *pmVar1 = TK_LOGICAL_AND;
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,"||",&local_cc1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_cc0);
  *pmVar1 = TK_LOGICAL_OR;
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"!",&local_ce9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ce8);
  *pmVar1 = TK_LOGICAL_NOT;
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d10,"->",&local_d11);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_d10);
  *pmVar1 = TK_ARROW;
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,".",&local_d39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_d38);
  *pmVar1 = TK_DOT;
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d60,"::",&local_d61);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_d60);
  *pmVar1 = TK_SCOPE;
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d88,"$",&local_d89);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_d88);
  *pmVar1 = TK_DOLAR;
  std::__cxx11::string::~string(local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_db0,"..",&local_db1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_db0);
  *pmVar1 = TK_INCLUSIVE_RANGE;
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd8,"...",&local_dd9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_dd8);
  *pmVar1 = TK_EXCLUSIVE_RANGE;
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e00,"?",&local_e01);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_e00);
  *pmVar1 = TK_TERNARY;
  std::__cxx11::string::~string(local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e28,"=>",&local_e29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_e28);
  *pmVar1 = TK_HASH_ARROW;
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e50,"=",&local_e51);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_e50);
  *pmVar1 = TK_ASSIGNMENT;
  std::__cxx11::string::~string(local_e50);
  std::allocator<char>::~allocator((allocator<char> *)&local_e51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e78,"&=",&local_e79);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_e78);
  *pmVar1 = TK_BITWISE_AND_ASSIGNMENT;
  std::__cxx11::string::~string(local_e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea0,"^=",&local_ea1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ea0);
  *pmVar1 = TK_BITWISE_XOR_ASSIGNMENT;
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec8,"|=",&local_ec9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ec8);
  *pmVar1 = TK_BITWISE_OR_ASSIGNMENT;
  std::__cxx11::string::~string(local_ec8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ef0,"~=",&local_ef1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_ef0);
  *pmVar1 = TK_BITWISE_NOT_ASSIGNMENT;
  std::__cxx11::string::~string(local_ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f18,"/=",&local_f19);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_f18);
  *pmVar1 = TK_DIVISION_ASSIGNMENT;
  std::__cxx11::string::~string(local_f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_f19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f40,"//=",&local_f41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_f40);
  *pmVar1 = TK_INTEGER_DIVISION_ASSIGNMENT;
  std::__cxx11::string::~string(local_f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_f41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f68,"-=",&local_f69);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_f68);
  *pmVar1 = TK_MINUS_ASSIGNMENT;
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f90,"%=",&local_f91);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_f90);
  *pmVar1 = TK_MODULO_ASSIGNMENT;
  std::__cxx11::string::~string(local_f90);
  std::allocator<char>::~allocator((allocator<char> *)&local_f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb8,"+=",&local_fb9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_fb8);
  *pmVar1 = TK_PLUS_ASSIGNMENT;
  std::__cxx11::string::~string(local_fb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fe0,"*=",&local_fe1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_fe0);
  *pmVar1 = TK_TIMES_ASSIGNMENT;
  std::__cxx11::string::~string(local_fe0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1008,"<<=",&local_1009);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1008);
  *pmVar1 = TK_SLL_ASSIGNMENT;
  std::__cxx11::string::~string(local_1008);
  std::allocator<char>::~allocator((allocator<char> *)&local_1009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1030,">>=",&local_1031);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1030);
  *pmVar1 = TK_SRA_ASSIGNMENT;
  std::__cxx11::string::~string(local_1030);
  std::allocator<char>::~allocator((allocator<char> *)&local_1031);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1058,">>>=",&local_1059);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1058);
  *pmVar1 = TK_SRL_ASSIGNMENT;
  std::__cxx11::string::~string(local_1058);
  std::allocator<char>::~allocator((allocator<char> *)&local_1059);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1080,":=",&local_1081);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1080);
  *pmVar1 = TK_SPECIAL_ASSIGNMENT;
  std::__cxx11::string::~string(local_1080);
  std::allocator<char>::~allocator((allocator<char> *)&local_1081);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10a8,"@",&local_10a9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_10a8);
  *pmVar1 = TK_AT;
  std::__cxx11::string::~string(local_10a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10d0,":",&local_10d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_10d0);
  *pmVar1 = TK_COLON;
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10f8,",",&local_10f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_10f8);
  *pmVar1 = TK_COMMA;
  std::__cxx11::string::~string(local_10f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1120,";",&local_1121);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1120);
  *pmVar1 = TK_SEMICOLON;
  std::__cxx11::string::~string(local_1120);
  std::allocator<char>::~allocator((allocator<char> *)&local_1121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1148,"(",&local_1149);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1148);
  *pmVar1 = TK_LEFT_PARENTHESIS;
  std::__cxx11::string::~string(local_1148);
  std::allocator<char>::~allocator((allocator<char> *)&local_1149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1170,")",&local_1171);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1170);
  *pmVar1 = TK_RIGHT_PARENTHESIS;
  std::__cxx11::string::~string(local_1170);
  std::allocator<char>::~allocator((allocator<char> *)&local_1171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1198,"[",&local_1199);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1198);
  *pmVar1 = TK_LEFT_SQUARE_BRACKET;
  std::__cxx11::string::~string(local_1198);
  std::allocator<char>::~allocator((allocator<char> *)&local_1199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c0,"]",&local_11c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_11c0);
  *pmVar1 = TK_RIGHT_SQUARE_BRACKET;
  std::__cxx11::string::~string(local_11c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11e8,"{",&local_11e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_11e8);
  *pmVar1 = TK_LEFT_CURLY_BRACKET;
  std::__cxx11::string::~string(local_11e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1210,"}",&local_1211);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::TokenKind>_>_>
           ::operator[](&this->operatorMap,(key_type *)local_1210);
  *pmVar1 = TK_RIGHT_CURLY_BRACKET;
  std::__cxx11::string::~string(local_1210);
  std::allocator<char>::~allocator((allocator<char> *)&local_1211);
  return;
}

Assistant:

Lex::Lex() {
    this->row = 1;
    this->column = 1;
    this->idx = 0;
    this->lexemBegin = 0;
    this->lexemEnd = 0;
    this->newline = true;
    this->hasLexem = false;
    this->indentationStack.push(0);

    if (true) {
        keywordsMap["def"] = TK_DEF;
        keywordsMap["class"] = TK_CLASS;
        keywordsMap["var"] = TK_VAR;
        keywordsMap["const"] = TK_CONSTANT;
        keywordsMap["constant"] = TK_CONSTANT;

        keywordsMap["struct"] = TK_STRUCT;
        keywordsMap["enum"] = TK_ENUM;
        keywordsMap["union"] = TK_UNION;

        keywordsMap["new"] = TK_NEW;
        keywordsMap["delete"] = TK_DELETE;
        keywordsMap["case"] = TK_CASE;
        keywordsMap["default"] = TK_DEFAULT;
        keywordsMap["with"] = TK_WITH;
        keywordsMap["pass"] = TK_PASS;
        keywordsMap["do"] = TK_DO;
        keywordsMap["from"] = TK_FROM;
        keywordsMap["sizeof"] = TK_SIZEOF;

        keywordsMap["import"] = TK_IMPORT;
        keywordsMap["as"] = TK_AS;
        keywordsMap["in"] = TK_IN;
        keywordsMap["null"] = TK_NULL;
        keywordsMap["true"] = TK_TRUE;
        keywordsMap["false"] = TK_FALSE;

        keywordsMap["if"] = TK_IF;
        keywordsMap["elif"] = TK_ELIF;
        keywordsMap["else"] = TK_ELSE;

        keywordsMap["for"] = TK_FOR;
        keywordsMap["while"] = TK_WHILE;

        keywordsMap["break"] = TK_BREAK;
        keywordsMap["continue"] = TK_CONTINUE;
        keywordsMap["goto"] = TK_GOTO;
        keywordsMap["yield"] = TK_YIELD;
        keywordsMap["return"] = TK_RETURN;

        keywordsMap["and"] = TK_AND;
        keywordsMap["or"] = TK_OR;
        keywordsMap["not"] = TK_NOT;

        /* types */
        keywordsMap["u8"] = TK_U8;
        keywordsMap["u16"] = TK_U16;
        keywordsMap["u32"] = TK_U32;
        keywordsMap["u64"] = TK_U64;

        keywordsMap["i8"] = TK_I8;
        keywordsMap["i16"] = TK_I16;
        keywordsMap["i32"] = TK_I32;
        keywordsMap["i64"] = TK_I64;

        keywordsMap["void"] = TK_VOID;
        keywordsMap["symbol"] = TK_SYMBOL;
        keywordsMap["bool"] = TK_BOOL;
        keywordsMap["uchar"] = TK_UCHAR;
        keywordsMap["char"] = TK_CHAR;
        keywordsMap["ushort"] = TK_USHORT;
        keywordsMap["short"] = TK_SHORT;
        keywordsMap["uint"] = TK_UINT;
        keywordsMap["int"] = TK_INT;
        keywordsMap["ulong"] = TK_ULONG;
        keywordsMap["long"] = TK_LONG;
        keywordsMap["float"] = TK_FLOAT;
        keywordsMap["double"] = TK_DOUBLE;


        /* operators */

        /* increment and decrement */
        operatorMap["++"] = TK_INC;
        operatorMap["--"] = TK_DEC;

        /* arithmetic */
        operatorMap["+"] = TK_PLUS;
        operatorMap["-"] = TK_MINUS;
        operatorMap["*"] = TK_TIMES;
        operatorMap["/"] = TK_DIVISION;
        operatorMap["//"] = TK_INTEGER_DIVISION;
        operatorMap["%"] = TK_MODULO;
        operatorMap["**"] = TK_POWER;

        /* relational */
        operatorMap["=="] = TK_EQ;
        operatorMap["!="] = TK_NE;
        operatorMap[">"] = TK_GT;
        operatorMap["<"] = TK_LT;
        operatorMap[">="] = TK_GE;
        operatorMap["<="] = TK_LE;

        /* bitwise */
        operatorMap["&"] = TK_BITWISE_AND;
        operatorMap["|"] = TK_BITWISE_OR;
        operatorMap["^"] = TK_BITWISE_XOR;
        operatorMap["~"] = TK_BITWISE_NOT;
        operatorMap["<<"] = TK_SLL;
        operatorMap[">>"] = TK_SRA;
        operatorMap[">>>"] = TK_SRL;

        /* logical */
        operatorMap["&&"] = TK_LOGICAL_AND;
        operatorMap["||"] = TK_LOGICAL_OR;
        operatorMap["!"] = TK_LOGICAL_NOT;

        /* member access */
        operatorMap["->"] = TK_ARROW;
        operatorMap["."] = TK_DOT;

        /* scope */
        operatorMap["::"] = TK_SCOPE;
        operatorMap["$"] = TK_DOLAR;

        /* ranges */
        operatorMap[".."] = TK_INCLUSIVE_RANGE;
        operatorMap["..."] = TK_EXCLUSIVE_RANGE;

        /* ternary */
        operatorMap["?"] = TK_TERNARY;

        /* hash arrow*/
        operatorMap["=>"] = TK_HASH_ARROW;

        /* assignments */
        operatorMap["="] = TK_ASSIGNMENT;
        operatorMap["&="] = TK_BITWISE_AND_ASSIGNMENT;
        operatorMap["^="] = TK_BITWISE_XOR_ASSIGNMENT;
        operatorMap["|="] = TK_BITWISE_OR_ASSIGNMENT;
        operatorMap["~="] = TK_BITWISE_NOT_ASSIGNMENT;
        operatorMap["/="] = TK_DIVISION_ASSIGNMENT;
        operatorMap["//="] = TK_INTEGER_DIVISION_ASSIGNMENT;
        operatorMap["-="] = TK_MINUS_ASSIGNMENT;
        operatorMap["%="] = TK_MODULO_ASSIGNMENT;
        operatorMap["+="] = TK_PLUS_ASSIGNMENT;
        operatorMap["*="] = TK_TIMES_ASSIGNMENT;
        operatorMap["<<="] = TK_SLL_ASSIGNMENT;
        operatorMap[">>="] = TK_SRA_ASSIGNMENT;
        operatorMap[">>>="] = TK_SRL_ASSIGNMENT;
        operatorMap[":="] = TK_SPECIAL_ASSIGNMENT;

        /* punctuation */
        operatorMap["@"] = TK_AT;
        operatorMap[":"] = TK_COLON;
        operatorMap[","] = TK_COMMA;
        operatorMap[";"] = TK_SEMICOLON;
        operatorMap["("] = TK_LEFT_PARENTHESIS;
        operatorMap[")"] = TK_RIGHT_PARENTHESIS;
        operatorMap["["] = TK_LEFT_SQUARE_BRACKET;
        operatorMap["]"] = TK_RIGHT_SQUARE_BRACKET;
        operatorMap["{"] = TK_LEFT_CURLY_BRACKET;
        operatorMap["}"] = TK_RIGHT_CURLY_BRACKET;
    }
}